

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

sxi32 HashmapNodeCmp(jx9_hashmap_node *pLeft,jx9_hashmap_node *pRight,int bStrict)

{
  sxi32 sVar1;
  int iNest;
  jx9_value sObj2;
  jx9_value sObj1;
  anon_union_8_3_18420de5_for_x local_a8;
  undefined8 uStack_a0;
  jx9_vm *local_98;
  jx9_vm *pjStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  anon_union_8_3_18420de5_for_x local_68;
  undefined8 uStack_60;
  jx9_vm *local_58;
  jx9_vm *pjStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  
  if (pLeft == pRight) {
    sVar1 = 0;
  }
  else {
    local_58 = pLeft->pMap->pVm;
    uStack_30 = 0;
    local_68.rVal = 0.0;
    local_48 = 0;
    uStack_40 = 0;
    iNest = 0;
    local_38 = 0;
    uStack_60 = 0x20;
    local_98 = pLeft->pMap->pVm;
    uStack_70 = 0;
    local_a8.rVal = 0.0;
    local_88 = 0;
    uStack_80 = 0;
    local_78 = 0;
    uStack_a0 = 0x20;
    pjStack_90 = local_98;
    pjStack_50 = local_58;
    jx9HashmapExtractNodeValue(pLeft,(jx9_value *)&local_68,0);
    jx9HashmapExtractNodeValue(pRight,(jx9_value *)&local_a8,0);
    sVar1 = jx9MemObjCmp((jx9_value *)&local_68,(jx9_value *)&local_a8,bStrict,iNest);
    jx9MemObjRelease((jx9_value *)&local_68);
    jx9MemObjRelease((jx9_value *)&local_a8);
  }
  return sVar1;
}

Assistant:

static sxi32 HashmapNodeCmp(jx9_hashmap_node *pLeft, jx9_hashmap_node *pRight, int bStrict)
{
	jx9_value sObj1, sObj2;
	sxi32 rc;
	if( pLeft == pRight ){
		/*
		 * Same node.Refer to the sort() implementation defined
		 * below for more information on this sceanario.
		 */
		return 0;
	}
	/* Do the comparison */
	jx9MemObjInit(pLeft->pMap->pVm, &sObj1);
	jx9MemObjInit(pLeft->pMap->pVm, &sObj2);
	jx9HashmapExtractNodeValue(pLeft, &sObj1, FALSE);
	jx9HashmapExtractNodeValue(pRight, &sObj2, FALSE);
	rc = jx9MemObjCmp(&sObj1, &sObj2, bStrict, 0);
	jx9MemObjRelease(&sObj1);
	jx9MemObjRelease(&sObj2);
	return rc;
}